

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_local_date_abi_cxx11_
          (result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  type rollback;
  value_type *pvVar5;
  reference pcVar6;
  internal_error *piVar7;
  syntax_error *this_00;
  pair<toml::local_date,_toml::detail::region> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d58;
  int local_ce0;
  bool local_cdb;
  bool local_cd9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b98;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b7a;
  undefined1 local_b79;
  source_location local_b78;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b28;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b20;
  iterator local_ab0;
  size_type local_aa8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_aa0;
  allocator<char> local_a81;
  string local_a80;
  string local_a60;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a40;
  char *local_a20;
  undefined4 local_a18;
  local_date local_a14;
  pair<toml::local_date,_toml::detail::region> local_a10;
  success<std::pair<toml::local_date,_toml::detail::region>_> local_9c0;
  undefined1 local_969;
  source_location local_968;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_918;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f2;
  undefined1 local_8f1;
  source_location local_8f0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8a0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_898;
  iterator local_828;
  size_type local_820;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_818;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  int local_7b8;
  bool local_7b1;
  int max_day;
  bool is_leap;
  char local_789;
  undefined1 local_788 [7];
  int8_t day;
  char local_761;
  undefined1 local_760 [7];
  int8_t month;
  short local_73c;
  undefined1 local_739;
  undefined1 local_738 [4];
  int16_t year;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6ca;
  undefined1 local_6c9;
  source_location local_6c8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_678;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_670;
  iterator local_600;
  size_type local_5f8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f0;
  allocator<char> local_5d1;
  string local_5d0;
  string local_5b0;
  undefined1 local_590 [8];
  result<toml::detail::region,_toml::detail::none_t> d;
  source_location local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c2;
  undefined1 local_4c1;
  source_location local_4c0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_470;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_468;
  iterator local_3f8;
  size_type local_3f0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  allocator<char> local_3c9;
  string local_3c8;
  string local_3a8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_388;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_380;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_378;
  undefined1 local_370 [8];
  result<toml::detail::region,_toml::detail::none_t> m;
  source_location local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2aa;
  undefined1 local_2a9;
  source_location local_2a8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  iterator local_1e0;
  size_type local_1d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_170;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_168;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_160;
  undefined1 local_158 [8];
  result<toml::detail::region,_toml::detail::none_t> y;
  string local_d8;
  undefined1 local_b8 [8];
  location inner_loc;
  result<toml::detail::region,_toml::detail::none_t> token;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  rollback = location::iter((location *)this);
  sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_,(location *)this);
  bVar1 = toml::result::operator_cast_to_bool((result *)&inner_loc.iter_);
  if (bVar1) {
    location::name_abi_cxx11_(&local_d8,(location *)this);
    pvVar5 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
    region::str_abi_cxx11_((string *)&y.field_1.succ.value.last_,pvVar5);
    location::location((location *)local_b8,&local_d8,(string *)&y.field_1.succ.value.last_);
    std::__cxx11::string::~string((string *)&y.field_1.succ.value.last_);
    std::__cxx11::string::~string((string *)&local_d8);
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_158,(location *)local_b8)
    ;
    bVar2 = toml::result::operator_cast_to_bool((result *)local_158);
    bVar1 = true;
    if (bVar2) {
      local_160._M_current = (char *)location::iter((location *)local_b8);
      local_168._M_current = (char *)location::end((location *)local_b8);
      bVar2 = __gnu_cxx::operator==(&local_160,&local_168);
      bVar1 = true;
      if (!bVar2) {
        local_170._M_current = (char *)location::iter((location *)local_b8);
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_170);
        bVar1 = *pcVar6 != '-';
      }
    }
    if (bVar1) {
      m.field_1._71_1_ = 1;
      piVar7 = (internal_error *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"toml::parse_local_date: invalid year format",&local_1b1);
      local_2a9 = 1;
      local_258 = &local_250;
      source_location::source_location(&local_2a8,(location *)local_b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[14],_true>
                (&local_250,&local_2a8,(char (*) [14])"should be `-`");
      local_2a9 = 0;
      local_1e0 = &local_250;
      local_1d8 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_2aa);
      __l_03._M_len = local_1d8;
      __l_03._M_array = local_1e0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_1d0,__l_03,&local_2aa);
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2c8);
      format_underline(&local_190,&local_1b0,&local_1d0,&local_2c8,false);
      source_location::source_location(&local_318,(location *)local_b8);
      internal_error::internal_error(piVar7,&local_190,&local_318);
      m.field_1._71_1_ = 0;
      __cxa_throw(piVar7,&internal_error::typeinfo,internal_error::~internal_error);
    }
    location::advance((location *)local_b8,1);
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_370,(location *)local_b8)
    ;
    bVar2 = toml::result::operator_cast_to_bool((result *)local_370);
    bVar1 = true;
    if (bVar2) {
      local_378._M_current = (char *)location::iter((location *)local_b8);
      local_380._M_current = (char *)location::end((location *)local_b8);
      bVar2 = __gnu_cxx::operator==(&local_378,&local_380);
      bVar1 = true;
      if (!bVar2) {
        local_388._M_current = (char *)location::iter((location *)local_b8);
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_388);
        bVar1 = *pcVar6 != '-';
      }
    }
    if (bVar1) {
      d.field_1._71_1_ = 1;
      piVar7 = (internal_error *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"toml::parse_local_date: invalid month format",&local_3c9);
      local_4c1 = 1;
      local_470 = &local_468;
      source_location::source_location(&local_4c0,(location *)local_b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[14],_true>
                (&local_468,&local_4c0,(char (*) [14])"should be `-`");
      local_4c1 = 0;
      local_3f8 = &local_468;
      local_3f0 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_4c2);
      __l_02._M_len = local_3f0;
      __l_02._M_array = local_3f8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_3e8,__l_02,&local_4c2);
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4e8);
      format_underline(&local_3a8,&local_3c8,&local_3e8,&local_4e8,false);
      source_location::source_location(&local_538,(location *)local_b8);
      internal_error::internal_error(piVar7,&local_3a8,&local_538);
      d.field_1._71_1_ = 0;
      __cxa_throw(piVar7,&internal_error::typeinfo,internal_error::~internal_error);
    }
    location::advance((location *)local_b8,1);
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_590,(location *)local_b8)
    ;
    bVar1 = toml::result::operator_cast_to_bool((result *)local_590);
    if (!bVar1) {
      local_739 = 1;
      piVar7 = (internal_error *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"toml::parse_local_date: invalid day format",&local_5d1);
      local_6c9 = 1;
      local_678 = &local_670;
      source_location::source_location(&local_6c8,(location *)local_b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[5],_true>
                (&local_670,&local_6c8,(char (*) [5])0x2fcef4);
      local_6c9 = 0;
      local_600 = &local_670;
      local_5f8 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_6ca);
      __l_01._M_len = local_5f8;
      __l_01._M_array = local_600;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_5f0,__l_01,&local_6ca);
      local_6e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_6e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_6e8);
      format_underline(&local_5b0,&local_5d0,&local_5f0,&local_6e8,false);
      source_location::source_location((source_location *)local_738,(location *)local_b8);
      internal_error::internal_error(piVar7,&local_5b0,(source_location *)local_738);
      local_739 = 0;
      __cxa_throw(piVar7,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar5 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_158);
    region::str_abi_cxx11_((string *)local_760,pvVar5);
    iVar4 = from_string<int>((string *)local_760,0);
    std::__cxx11::string::~string((string *)local_760);
    local_73c = (short)iVar4;
    pvVar5 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_370);
    region::str_abi_cxx11_((string *)local_788,pvVar5);
    iVar4 = from_string<int>((string *)local_788,0);
    std::__cxx11::string::~string((string *)local_788);
    local_761 = (char)iVar4;
    pvVar5 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_590);
    region::str_abi_cxx11_((string *)&max_day,pvVar5);
    iVar4 = from_string<int>((string *)&max_day,0);
    cVar3 = (char)iVar4;
    std::__cxx11::string::~string((string *)&max_day);
    local_cd9 = false;
    if ((int)local_73c % 4 == 0) {
      local_cdb = (int)local_73c % 100 != 0 || (int)local_73c % 400 == 0;
      local_cd9 = local_cdb;
    }
    local_7b1 = local_cd9;
    if (local_761 == '\x02') {
      local_ce0 = 0x1c;
      if (local_cd9 != false) {
        local_ce0 = 0x1d;
      }
    }
    else {
      bVar1 = true;
      if (((local_761 != '\x04') && (bVar1 = true, local_761 != '\x06')) &&
         (bVar1 = true, local_761 != '\t')) {
        bVar1 = local_761 == '\v';
      }
      local_ce0 = 0x1f;
      if (bVar1) {
        local_ce0 = 0x1e;
      }
    }
    local_7b8 = local_ce0;
    local_789 = cVar3;
    if (((local_761 < '\x01') || ('\f' < local_761)) || ((cVar3 < '\x01' || (local_ce0 < cVar3)))) {
      local_969 = 1;
      this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f8,"toml::parse_date: invalid date: it does not conform RFC3339."
                 ,&local_7f9);
      local_8f1 = 1;
      local_8a0 = &local_898;
      source_location::source_location(&local_8f0,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[78],_true>
                (&local_898,&local_8f0,
                 (char (*) [78])
                 "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
      local_8f1 = 0;
      local_828 = &local_898;
      local_820 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_8f2);
      __l_00._M_len = local_820;
      __l_00._M_array = local_828;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_818,__l_00,&local_8f2);
      local_918.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_918.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_918.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_918);
      format_underline(&local_7d8,&local_7f8,&local_818,&local_918,false);
      source_location::source_location(&local_968,(location *)local_b8);
      syntax_error::syntax_error(this_00,&local_7d8,&local_968);
      local_969 = 0;
      __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    local_date::local_date(&local_a14,(int)local_73c,local_761 - Feb,(int)cVar3);
    pvVar5 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
    std::make_pair<toml::local_date,toml::detail::region_const&>(&local_a10,&local_a14,pvVar5);
    ok<std::pair<toml::local_date,toml::detail::region>>(&local_9c0,(toml *)&local_a10,v);
    result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_9c0);
    success<std::pair<toml::local_date,_toml::detail::region>_>::~success(&local_9c0);
    std::pair<toml::local_date,_toml::detail::region>::~pair(&local_a10);
    local_a18 = 1;
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_590);
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_370);
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_158);
    location::~location((location *)local_b8);
  }
  else {
    local_a20 = rollback._M_current;
    location::reset((location *)this,(const_iterator)rollback._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"toml::parse_local_date: ",&local_a81);
    local_b79 = 1;
    local_b28 = &local_b20;
    source_location::source_location(&local_b78,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[35],_true>
              (&local_b20,&local_b78,(char (*) [35])"the next token is not a local_date");
    local_b79 = 0;
    local_ab0 = &local_b20;
    local_aa8 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_b7a);
    __l._M_len = local_aa8;
    __l._M_array = local_ab0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_aa0,__l,&local_b7a);
    local_b98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b98);
    format_underline(&local_a60,&local_a80,&local_aa0,&local_b98,false);
    err<std::__cxx11::string>(&local_a40,(toml *)&local_a60,v_00);
    result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_a40);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_a40);
    std::__cxx11::string::~string((string *)&local_a60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b98);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_aa0);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_b7a);
    local_d58 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_ab0;
    do {
      local_d58 = local_d58 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_d58);
    } while (local_d58 != &local_b20);
    source_location::~source_location(&local_b78);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator(&local_a81);
    local_a18 = 1;
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<local_date, region>, std::string>
parse_local_date(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_local_date::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());

        const auto y = lex_date_fullyear::invoke(inner_loc);
        if(!y || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid year format",
                {{source_location(inner_loc), "should be `-`"}}),
                source_location(inner_loc));
        }
        inner_loc.advance();
        const auto m = lex_date_month::invoke(inner_loc);
        if(!m || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid month format",
                {{source_location(inner_loc), "should be `-`"}}),
                source_location(inner_loc));
        }
        inner_loc.advance();
        const auto d = lex_date_mday::invoke(inner_loc);
        if(!d)
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid day format",
                {{source_location(inner_loc), "here"}}),
                source_location(inner_loc));
        }

        const auto year  = static_cast<std::int16_t>(from_string<int>(y.unwrap().str(), 0));
        const auto month = static_cast<std::int8_t >(from_string<int>(m.unwrap().str(), 0));
        const auto day   = static_cast<std::int8_t >(from_string<int>(d.unwrap().str(), 0));

        // We briefly check whether the input date is valid or not. But here, we
        // only check if the RFC3339 compliance.
        //     Actually there are several special date that does not exist,
        // because of historical reasons, such as 1582/10/5-1582/10/14 (only in
        // several countries). But here, we do not care about such a complicated
        // rule. It makes the code complicated and there is only low probability
        // that such a specific date is needed in practice. If someone need to
        // validate date accurately, that means that the one need a specialized
        // library for their purpose in a different layer.
        {
            const bool is_leap = (year % 4 == 0) && ((year % 100 != 0) || (year % 400 == 0));
            const auto max_day = (month == 2) ? (is_leap ? 29 : 28) :
                ((month == 4 || month == 6 || month == 9 || month == 11) ? 30 : 31);

            if((month < 1 || 12 < month) || (day < 1 || max_day < day))
            {
                throw syntax_error(format_underline("toml::parse_date: "
                    "invalid date: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }
        }
        return ok(std::make_pair(local_date(year, static_cast<month_t>(month - 1), day),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_local_date: ",
            {{source_location(loc), "the next token is not a local_date"}}));
    }
}